

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_band.c
# Opt level: O2

void SUNDlsMat_bandGBTRS(sunrealtype **a,sunindextype n,sunindextype smu,sunindextype ml,
                        sunindextype *p,sunrealtype *b)

{
  sunrealtype *psVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  sunrealtype *psVar8;
  double dVar9;
  
  lVar2 = n + -1;
  lVar5 = 0;
  lVar3 = 0;
  if (0 < lVar2) {
    lVar3 = lVar2;
  }
  psVar8 = b + 1;
  lVar7 = 0;
  while (lVar7 != lVar3) {
    lVar6 = p[lVar7];
    dVar9 = b[lVar6];
    if (lVar6 != lVar7) {
      b[lVar6] = b[lVar7];
      b[lVar7] = dVar9;
    }
    lVar6 = ml + lVar7;
    if (n <= ml + lVar7) {
      lVar6 = lVar2;
    }
    if (lVar6 <= lVar7) {
      lVar6 = lVar7;
    }
    psVar1 = a[lVar7];
    for (lVar4 = 0; lVar6 + lVar5 != lVar4; lVar4 = lVar4 + 1) {
      psVar8[lVar4] = psVar1[smu + lVar4 + 1] * dVar9 + psVar8[lVar4];
    }
    lVar5 = lVar5 + -1;
    psVar8 = psVar8 + 1;
    lVar7 = lVar7 + 1;
  }
  lVar3 = smu * 8 + n * -8;
  for (; lVar3 = lVar3 + 8, -1 < lVar2; lVar2 = lVar2 + -1) {
    lVar5 = lVar2 - smu;
    if (lVar2 - smu < 1) {
      lVar5 = 0;
    }
    psVar8 = a[lVar2];
    dVar9 = b[lVar2] / psVar8[smu];
    b[lVar2] = dVar9;
    for (; lVar5 < lVar2; lVar5 = lVar5 + 1) {
      b[lVar5] = *(double *)((long)psVar8 + lVar5 * 8 + lVar3) * -dVar9 + b[lVar5];
    }
  }
  return;
}

Assistant:

void SUNDlsMat_bandGBTRS(sunrealtype** a, sunindextype n, sunindextype smu,
                         sunindextype ml, sunindextype* p, sunrealtype* b)
{
  sunindextype k, l, i, first_row_k, last_row_k;
  sunrealtype mult, *diag_k;

  /* Solve Ly = Pb, store solution y in b */

  for (k = 0; k < n - 1; k++)
  {
    l    = p[k];
    mult = b[l];
    if (l != k)
    {
      b[l] = b[k];
      b[k] = mult;
    }
    diag_k     = a[k] + smu;
    last_row_k = SUNMIN(n - 1, k + ml);
    for (i = k + 1; i <= last_row_k; i++) { b[i] += mult * diag_k[i - k]; }
  }

  /* Solve Ux = y, store solution x in b */

  for (k = n - 1; k >= 0; k--)
  {
    diag_k      = a[k] + smu;
    first_row_k = SUNMAX(0, k - smu);
    b[k] /= (*diag_k);
    mult = -b[k];
    for (i = first_row_k; i <= k - 1; i++) { b[i] += mult * diag_k[i - k]; }
  }
}